

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t add_owner_name(archive_match *a,match_list *list,wchar_t mbs,void *name)

{
  undefined4 uVar1;
  undefined4 uVar2;
  wchar_t wVar3;
  match *pmVar4;
  
  pmVar4 = (match *)calloc(1,0x78);
  if (pmVar4 == (match *)0x0) {
    archive_set_error(&a->archive,0xc,"No memory");
    (a->archive).state = 0x8000;
    wVar3 = L'\xffffffe2';
  }
  else {
    if (mbs == L'\0') {
      archive_mstring_copy_wcs(&pmVar4->pattern,(wchar_t *)name);
    }
    else {
      archive_mstring_copy_mbs(&pmVar4->pattern,(char *)name);
    }
    *list->last = pmVar4;
    list->last = (match **)pmVar4;
    uVar1 = list->count;
    uVar2 = list->unmatched_count;
    list->count = uVar1 + 1;
    list->unmatched_count = uVar2 + 1;
    *(byte *)&a->setflag = (byte)a->setflag | 4;
    wVar3 = L'\0';
  }
  return wVar3;
}

Assistant:

static int
add_owner_name(struct archive_match *a, struct match_list *list,
    int mbs, const void *name)
{
	struct match *match;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	if (mbs)
		archive_mstring_copy_mbs(&(match->pattern), name);
	else
		archive_mstring_copy_wcs(&(match->pattern), name);
	match_list_add(list, match);
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}